

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void PPRF_Eval(long msg)

{
  iterator iVar1;
  ostream *poVar2;
  mapped_type *ppuVar3;
  ostream *poVar4;
  int j;
  long lVar5;
  key_type local_30;
  
  iVar1 = std::
          _Hashtable<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&keys._M_h,&local_30);
  if (iVar1.super__Node_iterator_base<std::pair<const_long,_unsigned_char_*>,_false>._M_cur ==
      (__node_type *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"stop at punctured point !");
  }
  else {
    poVar4 = (ostream *)&std::cout;
    poVar2 = std::operator<<((ostream *)&std::cout,"Original pseudo random value of  ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2," is : ");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      ppuVar3 = std::__detail::
                _Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&keys,&local_30);
      printf("%02x ",(ulong)(*ppuVar3)[lVar5]);
    }
  }
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void PPRF_Eval(long msg ){
    if(keys.find(msg) == keys.end()){
        cout << "stop at punctured point !" << endl;
    }
    else{
        cout <<"Original pseudo random value of  "<< msg << " is : " << endl;
        for (int j = 0 ; j <16; ++j){
            printf ( "%02x ",keys[msg][j]);
        }
        cout << endl ;
    }
}